

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

CNetMessage * __thiscall
V1Transport::GetReceivedMessage
          (CNetMessage *__return_storage_ptr__,V1Transport *this,microseconds time,
          bool *reject_message)

{
  CMessageHeader *this_00;
  uint32_t uVar1;
  pointer pbVar2;
  string_view source_file;
  bool bVar3;
  uint256 *puVar4;
  Logger *pLVar5;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file_00;
  string_view str;
  string_view str_00;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  string_view str_01;
  string_view logging_function_00;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock37;
  uint256 hash;
  string log_msg;
  long *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  long *in_stack_fffffffffffffe88;
  unique_lock<std::mutex> local_168;
  string local_158;
  string local_138;
  string local_118;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_98;
  char *pcStack_90;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_168._M_device = &(this->m_recv_mutex).super_mutex;
  *reject_message = false;
  local_168._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_168);
  pbVar2 = (this->vRecv).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->m_recv).vch.
  super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start =
       (this->vRecv).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->m_recv).vch.
  super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = pbVar2;
  (__return_storage_ptr__->m_recv).vch.
  super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (this->vRecv).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->vRecv).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vRecv).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vRecv).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_recv).m_read_pos = (this->vRecv).m_read_pos;
  (__return_storage_ptr__->m_time).__r = 0;
  __return_storage_ptr__->m_message_size = 0;
  __return_storage_ptr__->m_raw_message_size = 0;
  (__return_storage_ptr__->m_type)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_type).field_2;
  (__return_storage_ptr__->m_type)._M_string_length = 0;
  (__return_storage_ptr__->m_type).field_2._M_local_buf[0] = '\0';
  this_00 = &this->hdr;
  CMessageHeader::GetCommand_abi_cxx11_(&local_58,this_00);
  GetReceivedMessage();
  (__return_storage_ptr__->m_time).__r = time.__r;
  uVar1 = (this->hdr).nMessageSize;
  __return_storage_ptr__->m_message_size = uVar1;
  __return_storage_ptr__->m_raw_message_size = uVar1 + 0x18;
  puVar4 = GetMessageHash(this);
  local_f8 = *(undefined8 *)(puVar4->super_base_blob<256U>).m_data._M_elems;
  uStack_f0 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 8);
  local_e8 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x10);
  uStack_e0 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x18);
  RandAddEvent((uint32_t)local_f8);
  if ((uint32_t)local_f8 == *(int *)(this->hdr).pchChecksum) {
    bVar3 = CMessageHeader::IsCommandValid(this_00);
    if (bVar3) goto LAB_001a24a4;
    pLVar5 = LogInstance();
    bVar3 = BCLog::Logger::WillLogCategoryLevel(pLVar5,NET,Debug);
    if (bVar3) {
      CMessageHeader::GetCommand_abi_cxx11_(&local_78,this_00);
      str._M_str = local_78._M_dataplus._M_p;
      str._M_len = local_78._M_string_length;
      SanitizeString_abi_cxx11_(&local_58,str,0);
      logging_function._M_str = "GetReceivedMessage";
      logging_function._M_len = 0x12;
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
      source_file_00._M_len = 0x50;
      LogPrintf_<std::__cxx11::string,unsigned_int,long>
                (logging_function,source_file_00,0x324,
                 IPC|PROXY|PRUNE|RAND|CMPCTBLOCK|REINDEX|ESTIMATEFEE|BENCH|HTTP,(Level)&local_58,
                 (char *)&__return_storage_ptr__->m_message_size,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &this->m_node_id,
                 (uint *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 in_stack_fffffffffffffe88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
      }
      local_118.field_2._M_allocated_capacity = local_78.field_2._M_allocated_capacity;
      local_118._M_dataplus._M_p = local_78._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) goto LAB_001a2498;
    }
  }
  else {
    pLVar5 = LogInstance();
    bVar3 = BCLog::Logger::WillLogCategoryLevel(pLVar5,NET,Debug);
    if (bVar3) {
      str_00._M_str = (__return_storage_ptr__->m_type)._M_dataplus._M_p;
      str_00._M_len = (__return_storage_ptr__->m_type)._M_string_length;
      SanitizeString_abi_cxx11_(&local_118,str_00,0);
      s.m_size = 4;
      s.m_data = (uchar *)&local_f8;
      HexStr_abi_cxx11_(&local_138,s);
      s_00.m_size = 4;
      s_00.m_data = (this->hdr).pchChecksum;
      HexStr_abi_cxx11_(&local_158,s_00);
      pLVar5 = LogInstance();
      bVar3 = BCLog::Logger::Enabled(pLVar5);
      if (bVar3) {
        local_58._M_string_length = 0;
        local_58.field_2._M_local_buf[0] = '\0';
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        tinyformat::
        format<std::__cxx11::string,unsigned_int,std::__cxx11::string,std::__cxx11::string,long>
                  (&local_78,
                   (tinyformat *)
                   "Header error: Wrong checksum (%s, %u bytes), expected %s was %s, peer=%d\n",
                   (char *)&local_118,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &__return_storage_ptr__->m_message_size,(uint *)&local_138,&local_158,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &this->m_node_id,in_stack_fffffffffffffe70);
        GetReceivedMessage();
        pLVar5 = LogInstance();
        local_98 = 0x50;
        pcStack_90 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
        source_file._M_len = 0x50;
        str_01._M_str = local_58._M_dataplus._M_p;
        str_01._M_len = local_58._M_string_length;
        logging_function_00._M_str = "GetReceivedMessage";
        logging_function_00._M_len = 0x12;
        BCLog::Logger::LogPrintStr(pLVar5,str_01,logging_function_00,source_file,800,NET,Debug);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,
                          CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                   local_58.field_2._M_local_buf[0]) + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
LAB_001a2498:
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
    }
  }
  *reject_message = true;
LAB_001a24a4:
  Reset(this);
  std::unique_lock<std::mutex>::~unique_lock(&local_168);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

CNetMessage V1Transport::GetReceivedMessage(const std::chrono::microseconds time, bool& reject_message)
{
    AssertLockNotHeld(m_recv_mutex);
    // Initialize out parameter
    reject_message = false;
    // decompose a single CNetMessage from the TransportDeserializer
    LOCK(m_recv_mutex);
    CNetMessage msg(std::move(vRecv));

    // store message type string, time, and sizes
    msg.m_type = hdr.GetCommand();
    msg.m_time = time;
    msg.m_message_size = hdr.nMessageSize;
    msg.m_raw_message_size = hdr.nMessageSize + CMessageHeader::HEADER_SIZE;

    uint256 hash = GetMessageHash();

    // We just received a message off the wire, harvest entropy from the time (and the message checksum)
    RandAddEvent(ReadLE32(hash.begin()));

    // Check checksum and header message type string
    if (memcmp(hash.begin(), hdr.pchChecksum, CMessageHeader::CHECKSUM_SIZE) != 0) {
        LogDebug(BCLog::NET, "Header error: Wrong checksum (%s, %u bytes), expected %s was %s, peer=%d\n",
                 SanitizeString(msg.m_type), msg.m_message_size,
                 HexStr(Span{hash}.first(CMessageHeader::CHECKSUM_SIZE)),
                 HexStr(hdr.pchChecksum),
                 m_node_id);
        reject_message = true;
    } else if (!hdr.IsCommandValid()) {
        LogDebug(BCLog::NET, "Header error: Invalid message type (%s, %u bytes), peer=%d\n",
                 SanitizeString(hdr.GetCommand()), msg.m_message_size, m_node_id);
        reject_message = true;
    }

    // Always reset the network deserializer (prepare for the next message)
    Reset();
    return msg;
}